

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall
QScroller::ensureVisible(QScroller *this,QRectF *rect,qreal xmargin,qreal ymargin,int scrollTime)

{
  bool bVar1;
  QScrollerPrivate *pQVar2;
  QDebug *pQVar3;
  ulong uVar4;
  QRectF *in_RSI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  double in_XMM1_Qa;
  QPointF QVar9;
  QScrollerPrivate *d;
  QPointF newPos;
  QRectF visibleRect;
  QSizeF visible;
  QRectF marginRect;
  QPointF startPos;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined4 in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffdc0;
  QRectF *in_stack_fffffffffffffdc8;
  QRectF *in_stack_fffffffffffffdd0;
  QScrollerPrivate *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffe08;
  QPointF *in_stack_fffffffffffffe18;
  QScrollerPrivate *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe30;
  int scrollTime_00;
  QPointF *in_stack_fffffffffffffe38;
  QScroller *in_stack_fffffffffffffe40;
  byte local_181;
  qreal local_148;
  qreal local_140;
  QPointF local_138;
  QPointF local_128;
  QPointF local_118 [3];
  QDebug local_e8;
  QDebug local_e0;
  QDebug local_d8 [5];
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  QRectF local_98;
  QSizeF local_78;
  QRectF local_68;
  QPointF local_48;
  QPointF local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QScroller *)0xa83bba);
  if ((pQVar2->state != Pressed) && (pQVar2->state != Dragging)) {
    local_181 = 0;
    if (pQVar2->state == Inactive) {
      QPointF::QPointF(&local_38);
      bVar1 = QScrollerPrivate::prepareScrolling
                        (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_181 = bVar1 ^ 0xff;
    }
    if ((local_181 & 1) == 0) {
      local_48.xp = -NAN;
      local_48.yp = -NAN;
      qVar5 = QScrollerPrivate::scrollingSegmentsEndPos
                        (in_stack_fffffffffffffdd8,
                         (Orientation)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
      qVar6 = QScrollerPrivate::scrollingSegmentsEndPos
                        (in_stack_fffffffffffffdd8,
                         (Orientation)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
      QPointF::QPointF(&local_48,qVar5,qVar6);
      local_68.xp = -NAN;
      local_68.yp = -NAN;
      local_68.w = -NAN;
      local_68.h = -NAN;
      qVar5 = QRectF::x(in_RSI);
      qVar6 = QRectF::y(in_RSI);
      qVar7 = QRectF::width(in_RSI);
      qVar8 = QRectF::height(in_RSI);
      QRectF::QRectF(&local_68,qVar5 - in_XMM0_Qa,qVar6 - in_XMM1_Qa,in_XMM0_Qa + in_XMM0_Qa + qVar7
                     ,in_XMM1_Qa + in_XMM1_Qa + qVar8);
      local_78.wd = (pQVar2->viewportSize).wd;
      local_78.ht = (pQVar2->viewportSize).ht;
      local_98.xp = -NAN;
      local_98.yp = -NAN;
      local_98.w = -NAN;
      local_98.h = -NAN;
      QRectF::QRectF(in_stack_fffffffffffffdd0,(QPointF *)in_stack_fffffffffffffdc8,
                     (QSizeF *)in_stack_fffffffffffffdc0);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      lcScroller();
      anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (in_stack_fffffffffffffdc0,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa83e8e);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
                   (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   (char *)0xa83ea7);
        QMessageLogger::debug();
        pQVar3 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffe08);
        QDebug::QDebug(&local_a8,pQVar3);
        ::operator<<((QDebug *)&local_a0,(QRectF *)&local_a8);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffe08);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffdc0,
                           (double)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffe08);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffdc0,
                           (double)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffe08);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffe08);
        QDebug::~QDebug(&local_a0);
        QDebug::~QDebug(&local_a8);
        QDebug::~QDebug(&local_b0);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcScroller();
      anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (in_stack_fffffffffffffdc0,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
      while( true ) {
        bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                          ((QLoggingCategoryMacroHolder *)&local_28);
        scrollTime_00 = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
        if (!bVar1) break;
        anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa83ff9);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
                   (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                   (char *)0xa84012);
        QMessageLogger::debug();
        pQVar3 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffe08);
        QDebug::QDebug(&local_e0,pQVar3);
        ::operator<<((QDebug *)local_d8,(QPointF *)&local_e0);
        QDebug::~QDebug(local_d8);
        QDebug::~QDebug(&local_e0);
        QDebug::~QDebug(&local_e8);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      uVar4 = QRectF::contains((QRectF *)&local_98);
      if ((uVar4 & 1) == 0) {
        local_118[0].xp = local_48.xp;
        local_118[0].yp = local_48.yp;
        qVar5 = QRectF::width(&local_98);
        qVar6 = QRectF::width(in_RSI);
        if (qVar6 <= qVar5) {
          qVar5 = QRectF::width(&local_98);
          qVar6 = QRectF::width(&local_68);
          if (qVar6 <= qVar5) {
            qVar5 = QRectF::left(&local_68);
            qVar6 = QRectF::left(&local_98);
            if (qVar5 <= qVar6) {
              qVar5 = QRectF::right(&local_68);
              qVar6 = QRectF::right(&local_98);
              if (qVar5 < qVar6) {
                qVar5 = QRectF::right(&local_68);
                qVar6 = QSizeF::width(&local_78);
                QPointF::setX(local_118,qVar5 - qVar6);
              }
            }
            else {
              qVar5 = QRectF::left(&local_68);
              QPointF::setX(local_118,qVar5);
            }
          }
          else {
            local_128 = QRectF::center(in_stack_fffffffffffffdc8);
            qVar5 = QPointF::x(&local_128);
            qVar6 = QRectF::width(&local_98);
            QPointF::setX(local_118,qVar5 - qVar6 / 2.0);
          }
        }
        else {
          in_stack_fffffffffffffe40 = (QScroller *)QRectF::left(in_RSI);
          qVar5 = QRectF::left(&local_98);
          if ((double)in_stack_fffffffffffffe40 <= qVar5) {
            in_stack_fffffffffffffe38 = (QPointF *)QRectF::right(in_RSI);
            qVar5 = QRectF::right(&local_98);
            if ((double)in_stack_fffffffffffffe38 < qVar5) {
              qVar5 = QRectF::right(in_RSI);
              qVar6 = QSizeF::width(&local_78);
              QPointF::setX(local_118,qVar5 - qVar6);
              scrollTime_00 = (int)((ulong)qVar5 >> 0x20);
            }
          }
          else {
            qVar5 = QRectF::left(in_RSI);
            QPointF::setX(local_118,qVar5);
          }
        }
        qVar5 = QRectF::height(&local_98);
        qVar6 = QRectF::height(in_RSI);
        if (qVar6 <= qVar5) {
          qVar5 = QRectF::height(&local_98);
          qVar6 = QRectF::height(&local_68);
          if (qVar6 <= qVar5) {
            in_stack_fffffffffffffdd0 = (QRectF *)QRectF::top(&local_68);
            qVar5 = QRectF::top(&local_98);
            if ((double)in_stack_fffffffffffffdd0 <= qVar5) {
              qVar5 = QRectF::bottom(&local_68);
              qVar6 = QRectF::bottom(&local_98);
              if (qVar5 < qVar6) {
                in_stack_fffffffffffffdc0 =
                     (QLoggingCategoryMacroHolder<(QtMsgType)0> *)QRectF::bottom(&local_68);
                qVar5 = QSizeF::height(&local_78);
                QPointF::setY(local_118,(double)in_stack_fffffffffffffdc0 - qVar5);
              }
            }
            else {
              qVar5 = QRectF::top(&local_68);
              QPointF::setY(local_118,qVar5);
            }
          }
          else {
            local_138 = QRectF::center(in_stack_fffffffffffffdc8);
            in_stack_fffffffffffffdd8 = (QScrollerPrivate *)QPointF::y(&local_138);
            qVar5 = QRectF::height(&local_98);
            QPointF::setY(local_118,(double)in_stack_fffffffffffffdd8 - qVar5 / 2.0);
          }
        }
        else {
          qVar5 = QRectF::top(in_RSI);
          qVar6 = QRectF::top(&local_98);
          if (qVar5 <= qVar6) {
            qVar5 = QRectF::bottom(in_RSI);
            qVar6 = QRectF::bottom(&local_98);
            if (qVar5 < qVar6) {
              qVar5 = QRectF::bottom(in_RSI);
              qVar6 = QSizeF::height(&local_78);
              QPointF::setX(local_118,qVar5 - qVar6);
            }
          }
          else {
            qVar5 = QRectF::top(in_RSI);
            QPointF::setX(local_118,qVar5);
          }
        }
        QVar9 = clampToRect((QPointF *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
        local_148 = QVar9.xp;
        local_118[0].xp = local_148;
        local_140 = QVar9.yp;
        local_118[0].yp = local_140;
        bVar1 = ::operator==((QPointF *)in_stack_fffffffffffffdc0,
                             (QPointF *)
                             CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        if (!bVar1) {
          scrollTo(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,scrollTime_00);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScroller::ensureVisible(const QRectF &rect, qreal xmargin, qreal ymargin, int scrollTime)
{
    Q_D(QScroller);

    if (d->state == Pressed || d->state == Dragging )
        return;

    if (d->state == Inactive && !d->prepareScrolling(QPointF()))
        return;

    // -- calculate the current pos (or the position after the current scroll)
    QPointF startPos(d->scrollingSegmentsEndPos(Qt::Horizontal),
                     d->scrollingSegmentsEndPos(Qt::Vertical));

    QRectF marginRect(rect.x() - xmargin, rect.y() - ymargin,
                      rect.width() + 2 * xmargin, rect.height() + 2 * ymargin);

    QSizeF visible = d->viewportSize;
    QRectF visibleRect(startPos, visible);

    qCDebug(lcScroller) << "QScroller::ensureVisible(" << rect << " [pix], " << xmargin
                        << " [pix], " << ymargin << " [pix], " << scrollTime << "[ms])";
    qCDebug(lcScroller) << "  --> content position:" << d->contentPosition;

    if (visibleRect.contains(marginRect))
        return;

    QPointF newPos = startPos;

    if (visibleRect.width() < rect.width()) {
        // at least try to move the rect into view
        if (rect.left() > visibleRect.left())
            newPos.setX(rect.left());
        else if (rect.right() < visibleRect.right())
            newPos.setX(rect.right() - visible.width());

    } else if (visibleRect.width() < marginRect.width()) {
        newPos.setX(rect.center().x() - visibleRect.width() / 2);
    } else if (marginRect.left() > visibleRect.left()) {
        newPos.setX(marginRect.left());
    } else if (marginRect.right() < visibleRect.right()) {
        newPos.setX(marginRect.right() - visible.width());
    }

    if (visibleRect.height() < rect.height()) {
        // at least try to move the rect into view
        if (rect.top() > visibleRect.top())
            newPos.setX(rect.top());
        else if (rect.bottom() < visibleRect.bottom())
            newPos.setX(rect.bottom() - visible.height());

    } else if (visibleRect.height() < marginRect.height()) {
        newPos.setY(rect.center().y() - visibleRect.height() / 2);
    } else if (marginRect.top() > visibleRect.top()) {
        newPos.setY(marginRect.top());
    } else if (marginRect.bottom() < visibleRect.bottom()) {
        newPos.setY(marginRect.bottom() - visible.height());
    }

    // clamp to maximum content position
    newPos = clampToRect(newPos, d->contentPosRange);
    if (newPos == startPos)
        return;

    scrollTo(newPos, scrollTime);
}